

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eager_singletons.cpp
# Opt level: O1

int main(void)

{
  provider<boost::ext::di::v1_3_0::aux::pair<implementation,_boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,_boost::ext::di::v1_3_0::aux::type_list<>_>_>,_boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_i>_>
  *in_RSI;
  scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>> *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  example local_19;
  shared_ptr<interface> local_18;
  
  if (implementation::ctor_calls()::calls != 0) {
    __assert_fail("0 == implementation::ctor_calls()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/eager_singletons.cpp"
                  ,0x4a,"int main()");
  }
  boost::ext::di::v1_3_0::scopes::singleton::
  scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::operator()
            (in_RDI,in_RSI);
  this = DAT_001040c8;
  if (DAT_001040c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      DAT_001040c8->_M_use_count = DAT_001040c8->_M_use_count + 1;
      UNLOCK();
    }
    else {
      DAT_001040c8->_M_use_count = DAT_001040c8->_M_use_count + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if (implementation::ctor_calls()::calls == 1) {
    boost::ext::di::v1_3_0::scopes::singleton::
    scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::operator()
              ((scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>
                *)this,in_RSI);
    local_18.super___shared_ptr<interface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         boost::ext::di::v1_3_0::scopes::singleton::
         scope_impl<implementation,boost::ext::di::v1_3_0::aux::integral_constant<bool,true>>::
         create_impl<implementation,boost::ext::di::v1_3_0::core::successful::provider<boost::ext::di::v1_3_0::aux::pair<implementation,boost::ext::di::v1_3_0::aux::pair<boost::ext::di::v1_3_0::type_traits::uniform,boost::ext::di::v1_3_0::aux::type_list<>>>,boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::detail::$_0::operator()<boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::config,boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::singleton,interface,implementation,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>,boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>>(boost::ext::di::v1_3_0::core::injector<boost::ext::di::v1_3_0::...,int,int,boost::ext::di::v1_3_0::no_name,void,boost::ext::di::v1_3_0::core::none>>)const::i>>const&)
         ::object;
    local_18.super___shared_ptr<interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         DAT_001040c8;
    if (DAT_001040c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        DAT_001040c8->_M_use_count = DAT_001040c8->_M_use_count + 1;
        UNLOCK();
      }
      else {
        DAT_001040c8->_M_use_count = DAT_001040c8->_M_use_count + 1;
      }
    }
    example::example(&local_19,0x2a,&local_18);
    if (local_18.super___shared_ptr<interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_18.super___shared_ptr<interface,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (implementation::ctor_calls()::calls == 1) {
      return 0;
    }
    __assert_fail("1 == implementation::ctor_calls()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/eager_singletons.cpp"
                  ,0x52,"int main()");
  }
  __assert_fail("1 == implementation::ctor_calls()",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/eager_singletons.cpp"
                ,0x4e,"int main()");
}

Assistant:

int main() {
  /*<<make injector configuration>>*/
  auto injector = di::make_injector(configuration());
  assert(0 == implementation::ctor_calls());

  /*<<eagerly initialize singletons>>*/
  eager_singletons(injector);
  assert(1 == implementation::ctor_calls());

  /*<<create `example` with already initialized singletons>>*/
  injector.create<example>();
  assert(1 == implementation::ctor_calls());
}